

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

mat3f * __thiscall hmi::renderer::get_view_matrix(mat3f *__return_storage_ptr__,renderer *this)

{
  anon_union_36_10_b4d23817_for_mat<float,_3UL>_2 local_50;
  anon_union_36_10_b4d23817_for_mat<float,_3UL>_2 local_2c;
  
  local_2c.data[0][0] = 2.0 / (this->m_view_size).field_0.data[0];
  local_2c.data[1][1] = -2.0 / (this->m_view_size).field_0.data[1];
  local_2c._4_8_ = 0;
  local_2c.data[1][0] = 0.0;
  local_2c._20_8_ = 0;
  local_2c._28_8_ = 0x3f80000000000000;
  local_50.data[0][2] = -(this->m_view_center).field_0.data[0];
  local_50.data[1][2] = -(this->m_view_center).field_0.data[1];
  local_50._0_8_ = 0x3f800000;
  local_50._12_8_ = 0x3f80000000000000;
  local_50._24_8_ = 0;
  local_50.data[2][2] = 1.0;
  operator*(__return_storage_ptr__,(mat<float,_3UL> *)&local_2c.xx,(mat<float,_3UL> *)&local_50.xx);
  return __return_storage_ptr__;
}

Assistant:

mat3f renderer::get_view_matrix() const {
    mat3f scaling(
      2.0f / m_view_size.x, 0.0f,                   0.0f,
      0.0f,                 - 2.0f / m_view_size.y, 0.0f,
      0.0f,                 0.0f,                   1.0f
    );

    mat3f translation(
      1.0f, 0.0f, - m_view_center.x,
      0.0f, 1.0f, - m_view_center.y,
      0.0f, 0.0f, 1.0f
    );

    return scaling * translation;
  }